

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerCPP::emit_header(CompilerCPP *this)

{
  SPIREntryPoint *pSVar1;
  runtime_error *prVar2;
  char *pcVar3;
  char *pcVar4;
  char (*in_stack_ffffffffffffffb8) [2];
  string local_40;
  
  pSVar1 = Compiler::get_entry_point((Compiler *)this);
  CompilerGLSL::statement<char_const(&)[52]>
            (&this->super_CompilerGLSL,
             (char (*) [52])"// This C++ shader is autogenerated by spirv-cross.");
  CompilerGLSL::statement<char_const(&)[46]>
            (&this->super_CompilerGLSL,
             (char (*) [46])"#include \"spirv_cross/internal_interface.hpp\"");
  CompilerGLSL::statement<char_const(&)[44]>
            (&this->super_CompilerGLSL,
             (char (*) [44])"#include \"spirv_cross/external_interface.h\"");
  CompilerGLSL::statement<char_const(&)[17]>
            (&this->super_CompilerGLSL,(char (*) [17])"#include <array>");
  CompilerGLSL::statement<char_const(&)[20]>
            (&this->super_CompilerGLSL,(char (*) [20])"#include <stdint.h>");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
  CompilerGLSL::statement<char_const(&)[29]>
            (&this->super_CompilerGLSL,(char (*) [29])"using namespace spirv_cross;");
  CompilerGLSL::statement<char_const(&)[21]>
            (&this->super_CompilerGLSL,(char (*) [21])"using namespace glm;");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
  CompilerGLSL::statement<char_const(&)[15]>
            (&this->super_CompilerGLSL,(char (*) [15])"namespace Impl");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  if (pSVar1->model < ExecutionModelKernel) {
    CompilerGLSL::statement<char_const(&)[14]>
              (&this->super_CompilerGLSL,(char (*) [14])"struct Shader");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    switch(pSVar1->model) {
    case ExecutionModelVertex:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x2e9f9c);
      pcVar4 = (char *)(this->resource_type)._M_string_length;
      pcVar3 = "VertexResources";
      break;
    case ExecutionModelTessellationControl:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x2ea06f);
      pcVar4 = (char *)(this->resource_type)._M_string_length;
      pcVar3 = "TessControlResources";
      break;
    case ExecutionModelTessellationEvaluation:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x2ea0bd);
      pcVar4 = (char *)(this->resource_type)._M_string_length;
      pcVar3 = "TessEvaluationResources";
      break;
    case ExecutionModelGeometry:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x2e9f54);
      pcVar4 = (char *)(this->resource_type)._M_string_length;
      pcVar3 = "GeometryResources";
      break;
    case ExecutionModelFragment:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x2e9fe0);
      pcVar4 = (char *)(this->resource_type)._M_string_length;
      pcVar3 = "FragmentResources";
      break;
    case ExecutionModelGLCompute:
      join<char_const(&)[54],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                (&local_40,(spirv_cross *)"ComputeShader<Impl::Shader, Impl::Shader::Resources, ",
                 (char (*) [54])&pSVar1->workgroup_size,(uint *)0x2f4768,
                 (char (*) [3])&(pSVar1->workgroup_size).y,(uint *)0x2f4768,
                 (char (*) [3])&(pSVar1->workgroup_size).z,(uint *)0x2e9ac1,
                 in_stack_ffffffffffffffb8);
      ::std::__cxx11::string::operator=((string *)&this->impl_type,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->resource_type,0,(char *)(this->resource_type)._M_string_length,
                 0x2ea05e);
      return;
    default:
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported execution model.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)&local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::_M_replace((ulong)&this->resource_type,0,pcVar4,(ulong)pcVar3);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unsupported execution model.","");
  ::std::runtime_error::runtime_error(prVar2,(string *)&local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_0035b0b8;
  __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerCPP::emit_header()
{
	auto &execution = get_entry_point();

	statement("// This C++ shader is autogenerated by spirv-cross.");
	statement("#include \"spirv_cross/internal_interface.hpp\"");
	statement("#include \"spirv_cross/external_interface.h\"");
	// Needed to properly implement GLSL-style arrays.
	statement("#include <array>");
	statement("#include <stdint.h>");
	statement("");
	statement("using namespace spirv_cross;");
	statement("using namespace glm;");
	statement("");

	statement("namespace Impl");
	begin_scope();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelGLCompute:
	case ExecutionModelFragment:
	case ExecutionModelVertex:
		statement("struct Shader");
		begin_scope();
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported execution model.");
	}

	switch (execution.model)
	{
	case ExecutionModelGeometry:
		impl_type = "GeometryShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "GeometryResources";
		break;

	case ExecutionModelVertex:
		impl_type = "VertexShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "VertexResources";
		break;

	case ExecutionModelFragment:
		impl_type = "FragmentShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "FragmentResources";
		break;

	case ExecutionModelGLCompute:
		impl_type = join("ComputeShader<Impl::Shader, Impl::Shader::Resources, ", execution.workgroup_size.x, ", ",
		                 execution.workgroup_size.y, ", ", execution.workgroup_size.z, ">");
		resource_type = "ComputeResources";
		break;

	case ExecutionModelTessellationControl:
		impl_type = "TessControlShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "TessControlResources";
		break;

	case ExecutionModelTessellationEvaluation:
		impl_type = "TessEvaluationShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "TessEvaluationResources";
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported execution model.");
	}
}